

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::RecurrentParameter::InternalSwap(RecurrentParameter *this,RecurrentParameter *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  FillerParameter *pFVar4;
  void *pvVar5;
  UnknownFieldSet *other_00;
  
  pFVar4 = this->weight_filler_;
  this->weight_filler_ = other->weight_filler_;
  other->weight_filler_ = pFVar4;
  pFVar4 = this->bias_filler_;
  this->bias_filler_ = other->bias_filler_;
  other->bias_filler_ = pFVar4;
  uVar2 = this->num_output_;
  this->num_output_ = other->num_output_;
  other->num_output_ = uVar2;
  bVar1 = this->debug_info_;
  this->debug_info_ = other->debug_info_;
  other->debug_info_ = bVar1;
  bVar1 = this->expose_hidden_;
  this->expose_hidden_ = other->expose_hidden_;
  other->expose_hidden_ = bVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_004a6aaf;
LAB_004a6aa2:
    other_00 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_004a6aa2;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004a6aaf:
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void RecurrentParameter::InternalSwap(RecurrentParameter* other) {
  std::swap(weight_filler_, other->weight_filler_);
  std::swap(bias_filler_, other->bias_filler_);
  std::swap(num_output_, other->num_output_);
  std::swap(debug_info_, other->debug_info_);
  std::swap(expose_hidden_, other->expose_hidden_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}